

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  TokenKind TVar2;
  SyntaxKind SVar3;
  Scope *pSVar4;
  AnsiPortListSyntax *pAVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  ArgumentDirection direction;
  ModportItemSyntax *pMVar6;
  MemberSyntax *this;
  ModportSimplePortListSyntax *pMVar7;
  SyntaxNode *pSVar8;
  ModportNamedPortSyntax *pMVar9;
  ModportPortSymbol *this_00;
  ModportExplicitPortSyntax *syntax_04;
  ModportSubroutinePortListSyntax *pMVar10;
  MethodPrototypeSymbol *this_01;
  ModportSubroutinePortSyntax *syntax_05;
  ModportClockingPortSyntax *syntax_06;
  ModportClockingSymbol *this_02;
  logic_error *plVar11;
  long *plVar12;
  SourceLocation *pSVar13;
  char *func;
  size_type *psVar14;
  SourceLocation SVar15;
  long *plVar16;
  size_t sVar17;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *this_03;
  ulong uVar18;
  ModportSymbol *modport;
  ModportSymbol *local_150;
  ASTContext *local_148;
  string_view local_140;
  long local_130;
  long lStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  SourceLocation local_100;
  SourceLocation local_f8;
  long local_f0;
  SourceLocation SStack_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  ulong local_c0;
  ModportDeclarationSyntax *local_b8;
  ulong local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *local_68;
  Compilation *local_60;
  SmallVectorBase<const_slang::ast::ModportSymbol_*> *local_58;
  size_t local_50;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *local_48;
  size_t local_40;
  ModportSubroutinePortListSyntax *local_38;
  
  pSVar4 = (context->scope).ptr;
  local_148 = context;
  local_58 = results;
  if (pSVar4 == (Scope *)0x0) {
LAB_001c3eea:
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_001c3eff:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,func);
  }
  local_c0 = (syntax->items).elements.size_ + 1;
  if (1 < local_c0) {
    local_60 = pSVar4->compilation;
    local_68 = &syntax->items;
    local_c0 = local_c0 >> 1;
    local_50 = 0;
    local_b8 = syntax;
    do {
      pMVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::operator[]
                         (local_68,local_50);
      local_140 = parsing::Token::valueText(&pMVar6->name);
      local_100 = parsing::Token::location(&pMVar6->name);
      local_150 = BumpAllocator::
                  emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                            (&local_60->super_BumpAllocator,local_60,&local_140,&local_100);
      (local_150->super_Symbol).originatingSyntax = &pMVar6->super_SyntaxNode;
      pSVar4 = (local_148->scope).ptr;
      if (pSVar4 == (Scope *)0x0) goto LAB_001c3eea;
      psVar1 = &(local_b8->super_MemberSyntax).attributes.
                super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
      syntax_00.data_ = psVar1->data_;
      syntax_00.size_ = psVar1->size_;
      if ((local_b8->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
          psVar1->data_ == (pointer)0x0) {
        std::terminate();
      }
      Symbol::setAttributes(&local_150->super_Symbol,pSVar4,syntax_00);
      SmallVectorBase<slang::ast::ModportSymbol_const*>::
      emplace_back<slang::ast::ModportSymbol_const*const&>
                ((SmallVectorBase<slang::ast::ModportSymbol_const*> *)local_58,&local_150);
      pAVar5 = (pMVar6->ports).ptr;
      if (pAVar5 == (AnsiPortListSyntax *)0x0) {
        func = 
        "T slang::not_null<slang::syntax::AnsiPortListSyntax *>::get() const [T = slang::syntax::AnsiPortListSyntax *]"
        ;
        goto LAB_001c3eff;
      }
      local_b0 = (pAVar5->ports).elements.size_ + 1;
      if (1 < local_b0) {
        local_48 = &pAVar5->ports;
        local_b0 = local_b0 >> 1;
        sVar17 = 0;
        do {
          this = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::operator[]
                           (local_48,sVar17);
          SVar3 = (this->super_SyntaxNode).kind;
          local_40 = sVar17;
          if (SVar3 == ModportClockingPort) {
            syntax_06 = slang::syntax::SyntaxNode::as<slang::syntax::ModportClockingPortSyntax>
                                  (&this->super_SyntaxNode);
            this_02 = ModportClockingSymbol::fromSyntax(local_148,syntax_06);
            syntax_03.data_ =
                 (syntax_06->super_MemberSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
            syntax_03.size_ =
                 (syntax_06->super_MemberSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
            Symbol::setAttributes(&this_02->super_Symbol,&local_150->super_Scope,syntax_03);
            Scope::addMember(&local_150->super_Scope,&this_02->super_Symbol);
          }
          else if (SVar3 == ModportSubroutinePortList) {
            pMVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSubroutinePortListSyntax>
                                (&this->super_SyntaxNode);
            TVar2 = (pMVar10->importExport).kind;
            if (TVar2 == ExportKeyword) {
              local_150->hasExports = true;
            }
            uVar18 = (pMVar10->ports).elements.size_ + 1;
            if (1 < uVar18) {
              this_03 = &pMVar10->ports;
              sVar17 = 0;
              local_38 = pMVar10;
              do {
                pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                          operator[](this_03,sVar17)->super_SyntaxNode;
                if (pSVar8->kind == ModportSubroutinePort) {
                  pSVar4 = (local_148->scope).ptr;
                  if (pSVar4 == (Scope *)0x0) goto LAB_001c3eea;
                  syntax_05 = slang::syntax::SyntaxNode::
                              as<slang::syntax::ModportSubroutinePortSyntax>(pSVar8);
                  pMVar10 = local_38;
                  this_01 = MethodPrototypeSymbol::fromSyntax
                                      (pSVar4,syntax_05,TVar2 == ExportKeyword);
                }
                else {
                  if (pSVar8->kind != ModportNamedPort) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    local_e0[0] = local_d0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_e0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                               ,"");
                    plVar12 = (long *)std::__cxx11::string::append((char *)local_e0);
                    local_120._M_dataplus._M_p = (pointer)*plVar12;
                    psVar14 = (size_type *)(plVar12 + 2);
                    if ((size_type *)local_120._M_dataplus._M_p == psVar14) {
                      local_120.field_2._M_allocated_capacity = *psVar14;
                      local_120.field_2._8_8_ = plVar12[3];
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                    }
                    else {
                      local_120.field_2._M_allocated_capacity = *psVar14;
                    }
                    local_120._M_string_length = plVar12[1];
                    *plVar12 = (long)psVar14;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    std::__cxx11::to_string(&local_a8,0x173);
                    std::operator+(&local_88,&local_120,&local_a8);
                    pSVar13 = (SourceLocation *)std::__cxx11::string::append((char *)&local_88);
                    local_100 = *pSVar13;
                    SVar15 = (SourceLocation)(pSVar13 + 2);
                    if (local_100 == SVar15) {
                      local_f0 = *(long *)SVar15;
                      SStack_e8 = pSVar13[3];
                      local_100 = (SourceLocation)&local_f0;
                    }
                    else {
                      local_f0 = *(long *)SVar15;
                    }
                    local_f8 = pSVar13[1];
                    *pSVar13 = SVar15;
                    pSVar13[1] = (SourceLocation)0x0;
                    *(undefined1 *)(pSVar13 + 2) = 0;
                    plVar12 = (long *)std::__cxx11::string::append((char *)&local_100);
                    local_140._M_len = *plVar12;
                    plVar16 = plVar12 + 2;
                    if ((long *)local_140._M_len == plVar16) {
                      local_130 = *plVar16;
                      lStack_128 = plVar12[3];
                      local_140._M_len = (size_t)&local_130;
                    }
                    else {
                      local_130 = *plVar16;
                    }
                    local_140._M_str = (char *)plVar12[1];
                    *plVar12 = (long)plVar16;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    std::logic_error::logic_error(plVar11,(string *)&local_140);
                    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                                     (pSVar8);
                  this_01 = MethodPrototypeSymbol::fromSyntax
                                      (local_148,pMVar9,TVar2 == ExportKeyword);
                }
                syntax_02.data_ =
                     (pMVar10->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     data_;
                syntax_02.size_ =
                     (pMVar10->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     size_;
                Symbol::setAttributes(&this_01->super_Symbol,&local_150->super_Scope,syntax_02);
                Scope::addMember(&local_150->super_Scope,&this_01->super_Symbol);
                sVar17 = sVar17 + 1;
              } while (uVar18 >> 1 != sVar17);
            }
          }
          else {
            if (SVar3 != ModportSimplePortList) {
              plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
              local_e0[0] = local_d0;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                         ,"");
              plVar12 = (long *)std::__cxx11::string::append((char *)local_e0);
              local_120._M_dataplus._M_p = (pointer)*plVar12;
              psVar14 = (size_type *)(plVar12 + 2);
              if ((size_type *)local_120._M_dataplus._M_p == psVar14) {
                local_120.field_2._M_allocated_capacity = *psVar14;
                local_120.field_2._8_8_ = plVar12[3];
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              }
              else {
                local_120.field_2._M_allocated_capacity = *psVar14;
              }
              local_120._M_string_length = plVar12[1];
              *plVar12 = (long)psVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::__cxx11::to_string(&local_a8,0x180);
              std::operator+(&local_88,&local_120,&local_a8);
              pSVar13 = (SourceLocation *)std::__cxx11::string::append((char *)&local_88);
              local_100 = *pSVar13;
              SVar15 = (SourceLocation)(pSVar13 + 2);
              if (local_100 == SVar15) {
                local_f0 = *(long *)SVar15;
                SStack_e8 = pSVar13[3];
                local_100 = (SourceLocation)&local_f0;
              }
              else {
                local_f0 = *(long *)SVar15;
              }
              local_f8 = pSVar13[1];
              *pSVar13 = SVar15;
              pSVar13[1] = (SourceLocation)0x0;
              *(undefined1 *)(pSVar13 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_100);
              local_140._M_len = *plVar12;
              plVar16 = plVar12 + 2;
              if ((long *)local_140._M_len == plVar16) {
                local_130 = *plVar16;
                lStack_128 = plVar12[3];
                local_140._M_len = (size_t)&local_130;
              }
              else {
                local_130 = *plVar16;
              }
              local_140._M_str = (char *)plVar12[1];
              *plVar12 = (long)plVar16;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::logic_error::logic_error(plVar11,(string *)&local_140);
              __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            pMVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ModportSimplePortListSyntax>
                               (&this->super_SyntaxNode);
            direction = SemanticFacts::getDirection((pMVar7->direction).kind);
            uVar18 = (pMVar7->ports).elements.size_ + 1;
            if (1 < uVar18) {
              sVar17 = 0;
              do {
                pSVar8 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                          operator[](&pMVar7->ports,sVar17)->super_SyntaxNode;
                if (pSVar8->kind == ModportExplicitPort) {
                  syntax_04 = slang::syntax::SyntaxNode::
                              as<slang::syntax::ModportExplicitPortSyntax>(pSVar8);
                  this_00 = ModportPortSymbol::fromSyntax(local_148,direction,syntax_04);
                }
                else {
                  if (pSVar8->kind != ModportNamedPort) {
                    plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
                    local_e0[0] = local_d0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_e0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                               ,"");
                    plVar12 = (long *)std::__cxx11::string::append((char *)local_e0);
                    local_120._M_dataplus._M_p = (pointer)*plVar12;
                    psVar14 = (size_type *)(plVar12 + 2);
                    if ((size_type *)local_120._M_dataplus._M_p == psVar14) {
                      local_120.field_2._M_allocated_capacity = *psVar14;
                      local_120.field_2._8_8_ = plVar12[3];
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                    }
                    else {
                      local_120.field_2._M_allocated_capacity = *psVar14;
                    }
                    local_120._M_string_length = plVar12[1];
                    *plVar12 = (long)psVar14;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    std::__cxx11::to_string(&local_a8,0x156);
                    std::operator+(&local_88,&local_120,&local_a8);
                    pSVar13 = (SourceLocation *)std::__cxx11::string::append((char *)&local_88);
                    local_100 = *pSVar13;
                    SVar15 = (SourceLocation)(pSVar13 + 2);
                    if (local_100 == SVar15) {
                      local_f0 = *(long *)SVar15;
                      SStack_e8 = pSVar13[3];
                      local_100 = (SourceLocation)&local_f0;
                    }
                    else {
                      local_f0 = *(long *)SVar15;
                    }
                    local_f8 = pSVar13[1];
                    *pSVar13 = SVar15;
                    pSVar13[1] = (SourceLocation)0x0;
                    *(undefined1 *)(pSVar13 + 2) = 0;
                    plVar12 = (long *)std::__cxx11::string::append((char *)&local_100);
                    local_140._M_len = *plVar12;
                    plVar16 = plVar12 + 2;
                    if ((long *)local_140._M_len == plVar16) {
                      local_130 = *plVar16;
                      lStack_128 = plVar12[3];
                      local_140._M_len = (size_t)&local_130;
                    }
                    else {
                      local_130 = *plVar16;
                    }
                    local_140._M_str = (char *)plVar12[1];
                    *plVar12 = (long)plVar16;
                    plVar12[1] = 0;
                    *(undefined1 *)(plVar12 + 2) = 0;
                    std::logic_error::logic_error(plVar11,(string *)&local_140);
                    __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  pMVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ModportNamedPortSyntax>
                                     (pSVar8);
                  this_00 = ModportPortSymbol::fromSyntax(local_148,direction,pMVar9);
                }
                syntax_01.data_ =
                     (pMVar7->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     data_;
                syntax_01.size_ =
                     (pMVar7->super_MemberSyntax).attributes.
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     size_;
                Symbol::setAttributes((Symbol *)this_00,&local_150->super_Scope,syntax_01);
                Scope::addMember(&local_150->super_Scope,(Symbol *)this_00);
                sVar17 = sVar17 + 1;
              } while (uVar18 >> 1 != sVar17);
            }
          }
          sVar17 = local_40 + 1;
        } while (sVar17 != local_b0);
      }
      local_50 = local_50 + 1;
    } while (local_50 != local_c0);
  }
  return;
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                ASSUME_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    ASSUME_UNREACHABLE;
                }
            }
        }
    }
}